

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O0

MPP_RET vepu541_set_one_roi(void *buf,MppEncROIRegion *region,RK_S32 w,RK_S32 h)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint local_78;
  uint local_74;
  int local_70;
  int local_6c;
  ushort *local_68;
  Vepu541RoiCfg *dst;
  int local_58;
  RK_S32 y;
  RK_S32 x;
  RK_S32 pos_y_end;
  RK_S32 pos_x_end;
  RK_S32 pos_y_init;
  RK_S32 pos_x_init;
  RK_S32 roi_height;
  RK_S32 roi_width;
  MPP_RET ret;
  Vepu541RoiCfg cfg;
  RK_S32 stride_h;
  RK_S32 mb_h;
  RK_S32 mb_w;
  Vepu541RoiCfg *ptr;
  RK_S32 h_local;
  RK_S32 w_local;
  MppEncROIRegion *region_local;
  void *buf_local;
  
  iVar5 = (int)((long)((long)(w + 0xf) & 0xfffffffffffffff0U) / 0x10);
  iVar6 = (int)((long)((long)(h + 0xf) & 0xfffffffffffffff0U) / 0x10);
  uVar7 = iVar5 + 3U & 0xfffffffc;
  if ((buf == (void *)0x0) || (region == (MppEncROIRegion *)0x0)) {
    _mpp_log_l(2,"vepu541_common","invalid buf %p roi %p\n","vepu541_set_one_roi",buf,region);
  }
  else {
    local_74 = region->x / 0x10;
    local_78 = region->y / 0x10;
    local_6c = local_74 + (region->w + 0xf) / 0x10;
    local_70 = local_78 + (region->h + 0xf) / 0x10;
    if (iVar5 < local_6c) {
      local_6c = iVar5;
    }
    if (iVar6 < local_70) {
      local_70 = iVar6;
    }
    if (local_74 == 0) {
      local_74 = 0;
    }
    if (local_78 == 0) {
      local_78 = 0;
    }
    if ((local_6c <= (int)local_74) &&
       (_mpp_log_l(2,"vepu541_common","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "pos_x_end > pos_x_init","vepu541_set_one_roi",0x17a),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((local_70 <= (int)local_78) &&
       (_mpp_log_l(2,"vepu541_common","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "pos_y_end > pos_y_init","vepu541_set_one_roi",0x17b),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    uVar2 = region->intra;
    uVar3 = region->qp_area_idx;
    uVar4 = region->quality;
    bVar1 = region->abs_qp_en;
    _mb_h = (ushort *)((long)buf + (long)(int)(local_78 * uVar7 + local_74) * 2);
    for (dst._4_4_ = 0; dst._4_4_ < (int)(local_70 - local_78); dst._4_4_ = dst._4_4_ + 1) {
      local_68 = _mb_h;
      for (local_58 = 0; local_58 < (int)(local_6c - local_74); local_58 = local_58 + 1) {
        *local_68 = uVar2 & 1 | (uVar3 & 7) << 4 | 0x80 | (uVar4 & 0x7f) << 8 | (ushort)bVar1 << 0xf
        ;
        local_68 = local_68 + 1;
      }
      _mb_h = _mb_h + (int)uVar7;
    }
  }
  return MPP_NOK;
}

Assistant:

MPP_RET vepu541_set_one_roi(void *buf, MppEncROIRegion *region, RK_S32 w, RK_S32 h)
{
    Vepu541RoiCfg *ptr = (Vepu541RoiCfg *)buf;
    RK_S32 mb_w = MPP_ALIGN(w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;

    if (NULL == buf || NULL == region) {
        mpp_err_f("invalid buf %p roi %p\n", buf, region);
        goto DONE;
    }

    RK_S32 roi_width  = (region->w + 15) / 16;
    RK_S32 roi_height = (region->h + 15) / 16;
    RK_S32 pos_x_init = region->x / 16;
    RK_S32 pos_y_init = region->y / 16;
    RK_S32 pos_x_end  = pos_x_init + roi_width;
    RK_S32 pos_y_end  = pos_y_init + roi_height;
    RK_S32 x, y;

    pos_x_end = MPP_MIN(pos_x_end, mb_w);
    pos_y_end = MPP_MIN(pos_y_end, mb_h);
    pos_x_init = MPP_MAX(pos_x_init, 0);
    pos_y_init = MPP_MAX(pos_y_init, 0);

    mpp_assert(pos_x_end > pos_x_init);
    mpp_assert(pos_y_end > pos_y_init);

    cfg.force_intra = region->intra;
    cfg.reserved    = 0;
    cfg.qp_area_idx = region->qp_area_idx;
    // NOTE: When roi is enabled the qp_area_en should be one.
    cfg.qp_area_en  = 1;    // region->area_map_en;
    cfg.qp_adj      = region->quality;
    cfg.qp_adj_mode = region->abs_qp_en;

    ptr += pos_y_init * stride_h + pos_x_init;
    roi_width = pos_x_end - pos_x_init;
    roi_height = pos_y_end - pos_y_init;

    for (y = 0; y < roi_height; y++) {
        Vepu541RoiCfg *dst = ptr;

        for (x = 0; x < roi_width; x++, dst++)
            memcpy(dst, &cfg, sizeof(cfg));

        ptr += stride_h;
    }
DONE:
    return ret;
}